

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          ge_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_0UL,_0UL,_2UL,_1>_>
          *op)

{
  bool cond;
  printer *ppVar1;
  double local_38;
  double local_30;
  string_view local_28;
  ge_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_0UL,_0UL,_2UL,_1>_>
  *local_18;
  ge_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_0UL,_0UL,_2UL,_1>_>
  *op_local;
  printer *this_local;
  
  local_18 = op;
  op_local = (ge_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_0UL,_0UL,_2UL,_1>_>
              *)this;
  cond = detail::ge_::operator_cast_to_bool((ge_ *)op);
  local_28 = color(this,cond);
  ppVar1 = operator<<(this,&local_28);
  local_30 = detail::
             ge_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_0UL,_0UL,_2UL,_1>_>
             ::lhs(local_18);
  ppVar1 = operator<<(ppVar1,&local_30);
  ppVar1 = operator<<(ppVar1,(char (*) [5])" >= ");
  local_38 = detail::
             ge_<double,_boost::ext::ut::v1_1_8::detail::floating_point_constant<double,_0UL,_0UL,_2UL,_1>_>
             ::rhs(local_18);
  ppVar1 = operator<<(ppVar1,&local_38);
  ppVar1 = operator<<(ppVar1,(basic_string_view<char,_std::char_traits<char>_> *)this);
  return ppVar1;
}

Assistant:

auto& operator<<(const detail::ge_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " >= " << op.rhs()
                    << colors_.none);
    }